

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O1

void nn_ctx_leave(nn_ctx *self)

{
  nn_queue *self_00;
  int iVar1;
  nn_queue_item *pnVar2;
  nn_queue eventsto;
  nn_queue local_28;
  
  while (pnVar2 = nn_queue_pop(&self->events), pnVar2 != (nn_queue_item *)0x0) {
    nn_fsm_event_process((nn_fsm_event *)(pnVar2 + -4));
  }
  if (self->onleave != (nn_ctx_onleave)0x0) {
    (*self->onleave)(self);
  }
  self_00 = &self->eventsto;
  iVar1 = nn_queue_empty(self_00);
  if (iVar1 != 0) {
    nn_mutex_unlock(&self->sync);
    return;
  }
  local_28.head = self_00->head;
  local_28.tail = (self->eventsto).tail;
  nn_queue_init(self_00);
  nn_mutex_unlock(&self->sync);
  pnVar2 = nn_queue_pop(&local_28);
  while (pnVar2 != (nn_queue_item *)0x0) {
    nn_mutex_lock((nn_mutex_t *)pnVar2[-4].next[5].next);
    nn_fsm_event_process((nn_fsm_event *)(pnVar2 + -4));
    nn_ctx_leave((nn_ctx *)pnVar2[-4].next[5].next);
    pnVar2 = nn_queue_pop(&local_28);
  }
  nn_queue_term(&local_28);
  return;
}

Assistant:

void nn_ctx_leave (struct nn_ctx *self)
{
    struct nn_queue_item *item;
    struct nn_fsm_event *event;
    struct nn_queue eventsto;

    /*  Process any queued events before leaving the context. */
    while (1) {
        item = nn_queue_pop (&self->events);
        event = nn_cont (item, struct nn_fsm_event, item);
        if (!event)
            break;
        nn_fsm_event_process (event);
    }

    /*  Notify the owner that we are leaving the context. */
    if (nn_fast (self->onleave != NULL))
        self->onleave (self);

    /*  Shortcut in the case there are no external events. */
    if (nn_queue_empty (&self->eventsto)) {
        nn_mutex_unlock (&self->sync);
        return;
    }

    /*  Make a copy of the queue of the external events so that it does not
        get corrupted once we unlock the context. */
    eventsto = self->eventsto;
    nn_queue_init (&self->eventsto);

    nn_mutex_unlock (&self->sync);

    /*  Process any queued external events. Before processing each event
        lock the context it belongs to. */
    while (1) {
        item = nn_queue_pop (&eventsto);
        event = nn_cont (item, struct nn_fsm_event, item);
        if (!event)
            break;
        nn_ctx_enter (event->fsm->ctx);
        nn_fsm_event_process (event);
        nn_ctx_leave (event->fsm->ctx);
    }

    nn_queue_term (&eventsto);
}